

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScenePreprocessor.cpp
# Opt level: O2

void __thiscall Assimp::ScenePreprocessor::ProcessScene(ScenePreprocessor *this)

{
  aiMaterial **ppaVar1;
  aiMaterial *this_00;
  Logger *this_01;
  ScenePreprocessor *this_02;
  uint i_2;
  uint i;
  ulong uVar2;
  aiScene *paVar3;
  aiColor3D local_430;
  aiString name;
  
  paVar3 = this->scene;
  if (paVar3 != (aiScene *)0x0) {
    this_02 = this;
    for (uVar2 = 0; uVar2 < paVar3->mNumMeshes; uVar2 = uVar2 + 1) {
      ProcessMesh(this_02,paVar3->mMeshes[uVar2]);
      paVar3 = this->scene;
    }
    for (uVar2 = 0; uVar2 < paVar3->mNumAnimations; uVar2 = uVar2 + 1) {
      ProcessAnimation(this,paVar3->mAnimations[uVar2]);
      paVar3 = this->scene;
    }
    if ((paVar3->mNumMaterials == 0) && (paVar3->mNumMeshes != 0)) {
      ppaVar1 = (aiMaterial **)operator_new__(0x10);
      paVar3->mMaterials = ppaVar1;
      name.length = 0;
      name.data[0] = '\0';
      memset(name.data + 1,0x1b,0x3ff);
      this_00 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_00);
      this->scene->mMaterials[this->scene->mNumMaterials] = this_00;
      local_430.r = 0.6;
      local_430.g = 0.6;
      local_430.b = 0.6;
      uVar2 = 0;
      aiMaterial::AddProperty(this_00,&local_430,1,"$clr.diffuse",0,0);
      aiString::Set(&name,"DefaultMaterial");
      aiMaterial::AddProperty(this_00,&name,"?mat.name",0,0);
      this_01 = DefaultLogger::get();
      Logger::debug(this_01,"ScenePreprocessor: Adding default material \'DefaultMaterial\'");
      while( true ) {
        paVar3 = this->scene;
        if (paVar3->mNumMeshes <= uVar2) break;
        paVar3->mMeshes[uVar2]->mMaterialIndex = paVar3->mNumMaterials;
        uVar2 = uVar2 + 1;
      }
      paVar3->mNumMaterials = paVar3->mNumMaterials + 1;
    }
    return;
  }
  __assert_fail("scene != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/ScenePreprocessor.cpp"
                ,0x36,"void Assimp::ScenePreprocessor::ProcessScene()");
}

Assistant:

void ScenePreprocessor::ProcessScene ()
{
    ai_assert(scene != NULL);

    // Process all meshes
    for (unsigned int i = 0; i < scene->mNumMeshes;++i)
        ProcessMesh(scene->mMeshes[i]);

    // - nothing to do for nodes for the moment
    // - nothing to do for textures for the moment
    // - nothing to do for lights for the moment
    // - nothing to do for cameras for the moment

    // Process all animations
    for (unsigned int i = 0; i < scene->mNumAnimations;++i)
        ProcessAnimation(scene->mAnimations[i]);

    // Generate a default material if none was specified
    if (!scene->mNumMaterials && scene->mNumMeshes) {
        scene->mMaterials      = new aiMaterial*[2];
        aiMaterial* helper;

        aiString name;

        scene->mMaterials[scene->mNumMaterials] = helper = new aiMaterial();
        aiColor3D clr(0.6f,0.6f,0.6f);
        helper->AddProperty(&clr,1,AI_MATKEY_COLOR_DIFFUSE);

        // setup the default name to make this material identifiable
        name.Set(AI_DEFAULT_MATERIAL_NAME);
        helper->AddProperty(&name,AI_MATKEY_NAME);

        ASSIMP_LOG_DEBUG("ScenePreprocessor: Adding default material \'" AI_DEFAULT_MATERIAL_NAME  "\'");

        for (unsigned int i = 0; i < scene->mNumMeshes;++i) {
            scene->mMeshes[i]->mMaterialIndex = scene->mNumMaterials;
        }

        scene->mNumMaterials++;
    }
}